

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O0

void __thiscall
psy::C::Parser::DiagnosticsReporter::ExpectedFeature(DiagnosticsReporter *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_c1;
  string local_c0 [32];
  string local_a0 [32];
  DiagnosticDescriptor local_80;
  string *local_18;
  string *name_local;
  DiagnosticsReporter *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::__cxx11::string::string(local_a0,(string *)&ID_of_ExpectedFeature_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"[[unexpected extension or C dialect]]",&local_c1);
  std::operator+(&local_f8,local_18," is either an extension or unsupported in this dialect");
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_80,local_a0,local_c0,&local_f8,1);
  diagnoseOrDelayDiagnostic(this,&local_80);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_80);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string(local_a0);
  return;
}

Assistant:

void Parser::DiagnosticsReporter::ExpectedFeature(const std::string& name)
{
    diagnoseOrDelayDiagnostic(
                DiagnosticDescriptor(ID_of_ExpectedFeature,
                                     "[[unexpected extension or C dialect]]",
                                     name + " is either an extension or unsupported in this dialect",
                                     DiagnosticSeverity::Warning,
                                     DiagnosticCategory::Syntax));
}